

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O0

void Aig_ManStop(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  if (p->time1 != 0) {
    Abc_Print(1,"%s =","time1");
    Abc_Print(1,"%9.2f sec\n",((double)p->time1 * 1.0) / 1000000.0);
  }
  if (p->time2 != 0) {
    Abc_Print(1,"%s =","time2");
    Abc_Print(1,"%9.2f sec\n",((double)p->time2 * 1.0) / 1000000.0);
  }
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_1c) {
      Tim_ManStopP((Tim_Man_t **)&p->pManTime);
      if (p->pFanData != (int *)0x0) {
        Aig_ManFanoutStop(p);
      }
      if (p->pManExdc != (Aig_Man_t *)0x0) {
        Aig_ManStop(p->pManExdc);
      }
      Aig_MmFixedStop(p->pMemObjs,0);
      Vec_PtrFreeP(&p->vCis);
      Vec_PtrFreeP(&p->vCos);
      Vec_PtrFreeP(&p->vObjs);
      Vec_PtrFreeP(&p->vBufs);
      Vec_PtrFreeP(&p->unfold2_type_I);
      Vec_PtrFreeP(&p->unfold2_type_II);
      Vec_IntFreeP(&p->vLevelR);
      Vec_VecFreeP(&p->vLevels);
      Vec_IntFreeP(&p->vFlopNums);
      Vec_IntFreeP(&p->vFlopReprs);
      Vec_VecFreeP((Vec_Vec_t **)&p->vOnehots);
      Vec_VecFreeP(&p->vClockDoms);
      Vec_IntFreeP(&p->vProbs);
      Vec_IntFreeP(&p->vCiNumsOrig);
      Vec_PtrFreeP(&p->vMapped);
      if (p->vSeqModelVec != (Vec_Ptr_t *)0x0) {
        Vec_PtrFreeFree(p->vSeqModelVec);
      }
      if (p->pTerSimData != (uint *)0x0) {
        free(p->pTerSimData);
        p->pTerSimData = (uint *)0x0;
      }
      if (p->pFastSim != (int *)0x0) {
        free(p->pFastSim);
        p->pFastSim = (int *)0x0;
      }
      if (p->pData != (void *)0x0) {
        free(p->pData);
        p->pData = (void *)0x0;
      }
      if (p->pSeqModel != (Abc_Cex_t *)0x0) {
        free(p->pSeqModel);
        p->pSeqModel = (Abc_Cex_t *)0x0;
      }
      if (p->pName != (char *)0x0) {
        free(p->pName);
        p->pName = (char *)0x0;
      }
      if (p->pSpec != (char *)0x0) {
        free(p->pSpec);
        p->pSpec = (char *)0x0;
      }
      if (p->pObjCopies != (Aig_Obj_t **)0x0) {
        free(p->pObjCopies);
        p->pObjCopies = (Aig_Obj_t **)0x0;
      }
      if (p->pReprs != (Aig_Obj_t **)0x0) {
        free(p->pReprs);
        p->pReprs = (Aig_Obj_t **)0x0;
      }
      if (p->pEquivs != (Aig_Obj_t **)0x0) {
        free(p->pEquivs);
        p->pEquivs = (Aig_Obj_t **)0x0;
      }
      if (p->pTable != (Aig_Obj_t **)0x0) {
        free(p->pTable);
        p->pTable = (Aig_Obj_t **)0x0;
      }
      if (p != (Aig_Man_t *)0x0) {
        free(p);
      }
      return;
    }
    pvVar2 = Vec_PtrEntry(p->vObjs,local_1c);
    if ((pvVar2 != (void *)0x0) &&
       (((*(ulong *)((long)pvVar2 + 0x18) >> 4 & 1) != 0 ||
        ((*(ulong *)((long)pvVar2 + 0x18) >> 5 & 1) != 0)))) break;
    local_1c = local_1c + 1;
  }
  __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigMan.c"
                ,0xc3,"void Aig_ManStop(Aig_Man_t *)");
}

Assistant:

void Aig_ManStop( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    if ( p->time1 ) { ABC_PRT( "time1", p->time1 ); }
    if ( p->time2 ) { ABC_PRT( "time2", p->time2 ); }
    // make sure the nodes have clean marks
    Aig_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Tim_ManStopP( (Tim_Man_t **)&p->pManTime );
    if ( p->pFanData ) 
        Aig_ManFanoutStop( p );
    if ( p->pManExdc )  
        Aig_ManStop( p->pManExdc );
//    Aig_TableProfile( p );
    Aig_MmFixedStop( p->pMemObjs, 0 );
    Vec_PtrFreeP( &p->vCis );
    Vec_PtrFreeP( &p->vCos );
    Vec_PtrFreeP( &p->vObjs );
    Vec_PtrFreeP( &p->vBufs );
    //--jlong -- begin
    Vec_PtrFreeP( &p->unfold2_type_I );
    Vec_PtrFreeP( &p->unfold2_type_II );
    //--jlong -- end
    Vec_IntFreeP( &p->vLevelR );
    Vec_VecFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vFlopNums );
    Vec_IntFreeP( &p->vFlopReprs );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vOnehots );
    Vec_VecFreeP( &p->vClockDoms );
    Vec_IntFreeP( &p->vProbs );
    Vec_IntFreeP( &p->vCiNumsOrig );
    Vec_PtrFreeP( &p->vMapped );
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec );
    ABC_FREE( p->pTerSimData );
    ABC_FREE( p->pFastSim );
    ABC_FREE( p->pData );
    ABC_FREE( p->pSeqModel );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p->pObjCopies );
    ABC_FREE( p->pReprs );
    ABC_FREE( p->pEquivs );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}